

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O2

void Game::tumbleTilesUpOnGameboard(GameBoard *gb)

{
  ulong uVar1;
  ull uVar2;
  ulong uVar3;
  point2D_t *pt;
  pointer ptVar4;
  pointer ptVar5;
  ulong uVar6;
  undefined1 local_88 [16];
  pointer local_78;
  _Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
  local_70;
  _Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
  local_50;
  
  std::_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>::
  _Tuple_impl(&local_50,
              (_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
               *)gb);
  std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
            ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_50);
  uVar3 = 0;
  uVar6 = local_50.super__Head_base<0UL,_unsigned_long,_false>._M_head_impl & 0xffffffff;
  if ((int)local_50.super__Head_base<0UL,_unsigned_long,_false>._M_head_impl < 1) {
    uVar6 = uVar3;
  }
  ptVar4 = (pointer)0x1;
  for (; ptVar5 = ptVar4,
      uVar1 = local_50.super__Head_base<0UL,_unsigned_long,_false>._M_head_impl & 0xffffffff,
      uVar3 != uVar6; uVar3 = uVar3 + 1) {
    while (uVar1 - 1 != 0) {
      std::
      _Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>::
      _Tuple_impl(&local_70,
                  (_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
                   *)gb);
      local_88._0_8_ = ptVar5;
      uVar2 = anon_unknown_0::getTileValueOnGameboardDataArray
                        ((anon_unknown_0 *)&local_70,(gameboard_data_array_t *)local_88,pt);
      std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
                ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_70);
      if (uVar2 != 0) {
        local_78 = (pointer)0xffffffff;
        local_88._8_8_ = ptVar5;
        anon_unknown_0::moveOnGameboard(gb,(delta_t *)(local_88 + 8));
      }
      ptVar5 = (pointer)((long)&ptVar5->value + 1);
      uVar1 = uVar1 - 1;
    }
    ptVar4 = ptVar4 + 0x10000000;
  }
  return;
}

Assistant:

void tumbleTilesUpOnGameboard(GameBoard &gb) {
  doTumbleTilesUpOnGameboard(gb);
}